

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null_filter.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::IsNullFilter::ToExpression(IsNullFilter *this,Expression *column)

{
  pointer pBVar1;
  long *in_RDX;
  pointer *__ptr;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> local_28;
  _func_int **local_20;
  
  local_28.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._0_1_ = 0xe;
  make_uniq<duckdb::BoundOperatorExpression,duckdb::ExpressionType,duckdb::LogicalTypeId_const&>
            ((duckdb *)&local_20,(ExpressionType *)&local_28,&LogicalType::BOOLEAN);
  pBVar1 = unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                         *)&local_20);
  (**(code **)(*in_RDX + 0x88))(&local_28);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              *)&pBVar1->children,&local_28);
  if ((long *)CONCAT71(local_28.
                       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                       .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._1_7_,
                       local_28.
                       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                       .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._0_1_) !=
      (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(local_28.
                                   super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                   ._M_t.
                                   super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl.
                                   _1_7_,local_28.
                                         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                         ._M_t.
                                         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                         .super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                         _M_head_impl._0_1_) + 8))();
  }
  (this->super_TableFilter)._vptr_TableFilter = local_20;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> IsNullFilter::ToExpression(const Expression &column) const {
	auto result = make_uniq<BoundOperatorExpression>(ExpressionType::OPERATOR_IS_NULL, LogicalType::BOOLEAN);
	result->children.push_back(column.Copy());
	return std::move(result);
}